

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void delete_insn_data(MIR_insn_t insn)

{
  void *__ptr;
  void *__ptr_00;
  HTAB_MIR_item_t *pHVar1;
  bb_insn_t pbVar2;
  dead_var_t_conflict pdVar3;
  dead_var_t pdVar4;
  long lVar5;
  MIR_item_t pMVar6;
  size_t sVar7;
  bitmap_t pVVar8;
  bb_t_conflict bb;
  uint uVar9;
  DLIST_LINK_bb_insn_t *pDVar10;
  DLIST_LINK_dead_var_t *pDVar11;
  DLIST_dead_var_t *pDVar12;
  char **ppcVar13;
  HTAB_MIR_item_t **ppHVar14;
  size_t *rpost;
  MIR_context_t in_RSI;
  MIR_context_t pMVar15;
  VARR_uint8_t *dv;
  gen_ctx_t pgVar16;
  gen_ctx_t __ptr_01;
  
  __ptr = insn->data;
  if (((__ptr == (void *)0x0) || (uVar9 = *(int *)&insn->field_0x18 - 0xa7, 0xd < uVar9)) ||
     ((0x2007U >> (uVar9 & 0x1f) & 1) == 0)) {
    return;
  }
  if ((2 < uVar9) || (__ptr_00 = *(void **)((long)__ptr + 8), __ptr_00 == (void *)0x0)) {
LAB_0015fcf8:
    free(__ptr);
    return;
  }
  pgVar16 = *(gen_ctx_t *)((long)__ptr_00 + 0x10);
  if (pgVar16 != (gen_ctx_t)0x0) {
    free(pgVar16);
    free(__ptr_00);
    goto LAB_0015fcf8;
  }
  delete_insn_data_cold_1();
  DLIST_bb_insn_t_remove(&((bb_t_conflict)in_RSI->temp_string)->bb_insns,(bb_insn_t_conflict)in_RSI)
  ;
  in_RSI->gen_ctx->ctx = (MIR_context_t)0x0;
  pMVar15 = in_RSI;
  clear_bb_insn_dead_vars(pgVar16,(bb_insn_t_conflict)in_RSI);
  pHVar1 = in_RSI->module_item_tab;
  if (pHVar1 == (HTAB_MIR_item_t *)0x0) {
LAB_0015fd5f:
    free(in_RSI);
    return;
  }
  pgVar16 = (gen_ctx_t)pHVar1->arg;
  if (pgVar16 != (gen_ctx_t)0x0) {
    free(pgVar16);
    free(pHVar1);
    goto LAB_0015fd5f;
  }
  delete_bb_insn_cold_1();
  if ((pgVar16 != (gen_ctx_t)0x0) && (pMVar15 != (MIR_context_t)0x0)) {
    pbVar2 = ((DLIST_LINK_bb_insn_t *)&pMVar15->insn_nops)->prev;
    if (pbVar2 == (bb_insn_t)0x0) {
      if (pgVar16->ctx != pMVar15) goto LAB_0015fdcf;
      pgVar16->ctx = (MIR_context_t)pMVar15->unspec_protos;
    }
    else {
      (pbVar2->bb_insn_link).next = (bb_insn_t)pMVar15->unspec_protos;
    }
    if ((bb_insn_t)pMVar15->unspec_protos == (bb_insn_t)0x0) {
      if (*(MIR_context_t *)&pgVar16->optimize_level != pMVar15) goto LAB_0015fdd4;
      pDVar10 = (DLIST_LINK_bb_insn_t *)&pgVar16->optimize_level;
    }
    else {
      pDVar10 = &((bb_insn_t)pMVar15->unspec_protos)->bb_insn_link;
    }
    pDVar10->prev = pbVar2;
    ((DLIST_LINK_bb_insn_t *)&pMVar15->insn_nops)->prev = (bb_insn_t)0x0;
    pMVar15->unspec_protos = (VARR_MIR_proto_t *)0x0;
    return;
  }
  DLIST_bb_insn_t_remove_cold_1();
LAB_0015fdcf:
  DLIST_bb_insn_t_remove_cold_2();
LAB_0015fdd4:
  DLIST_bb_insn_t_remove_cold_3();
  dv = (VARR_uint8_t *)((DLIST_dead_var_t *)&pMVar15->temp_data)->head;
  if (dv != (VARR_uint8_t *)0x0) {
    __ptr_01 = pgVar16;
    do {
      pdVar3 = ((DLIST_LINK_dead_var_t *)&dv->size)->prev;
      pDVar12 = (DLIST_dead_var_t *)&(pdVar3->dead_var_link).next;
      if (pdVar3 == (dead_var_t_conflict)0x0) {
        pDVar12 = (DLIST_dead_var_t *)&pMVar15->temp_data;
      }
      pDVar12->head = (dead_var_t_conflict)dv->varr;
      if ((dead_var_t)dv->varr == (dead_var_t)0x0) {
        pDVar11 = (DLIST_LINK_dead_var_t *)&pMVar15->used_label_p;
        if (pMVar15->used_label_p != dv) {
          clear_bb_insn_dead_vars_cold_1();
          pdVar4 = (__ptr_01->free_dead_vars).tail;
          if (pdVar4 == (dead_var_t)0x0) {
            if ((__ptr_01->free_dead_vars).head == (dead_var_t_conflict)0x0) {
              pDVar12 = &__ptr_01->free_dead_vars;
              goto LAB_0015fe77;
            }
          }
          else {
            if ((pdVar4->dead_var_link).next == (dead_var_t)0x0) {
              pDVar12 = (DLIST_dead_var_t *)&(pdVar4->dead_var_link).next;
LAB_0015fe77:
              pDVar12->head = (dead_var_t_conflict)dv;
              dv->varr = (uint8_t *)0x0;
              ((DLIST_LINK_dead_var_t *)&dv->size)->prev = pdVar4;
              (__ptr_01->free_dead_vars).tail = (dead_var_t_conflict)dv;
              return;
            }
            free_dead_var_cold_1();
          }
          free_dead_var_cold_2();
          pMVar15 = __ptr_01->ctx;
          pHVar1 = *(HTAB_MIR_item_t **)&__ptr_01->debug_level;
          if (pHVar1 != (HTAB_MIR_item_t *)0x0) {
            pHVar1->free_func = (_func_void_MIR_item_t_void_ptr *)__ptr_01->to_free;
LAB_0015fec2:
            if (__ptr_01->to_free == (VARR_void_ptr_t *)0x0) {
              if ((gen_ctx_t)pMVar15->module_item_tab != __ptr_01) goto LAB_0015ff44;
              ppHVar14 = &pMVar15->module_item_tab;
            }
            else {
              ppHVar14 = (HTAB_MIR_item_t **)&__ptr_01->to_free[1].size;
            }
            *ppHVar14 = pHVar1;
            *(undefined8 *)&__ptr_01->debug_level = 0;
            __ptr_01->to_free = (VARR_void_ptr_t *)0x0;
            lVar5 = *(long *)&__ptr_01->optimize_level;
            pMVar6 = __ptr_01->curr_func_item;
            if (pMVar6 == (MIR_item_t)0x0) {
              if (*(gen_ctx_t *)(lVar5 + 0x30) != __ptr_01) goto LAB_0015ff49;
              *(FILE **)(lVar5 + 0x30) = __ptr_01->debug_file;
            }
            else {
              (pMVar6->item_link).next = (MIR_item_t)__ptr_01->debug_file;
            }
            if (__ptr_01->debug_file == (FILE *)0x0) {
              if (*(gen_ctx_t *)(lVar5 + 0x38) != __ptr_01) goto LAB_0015ff4e;
              ppcVar13 = (char **)(lVar5 + 0x38);
            }
            else {
              ppcVar13 = &__ptr_01->debug_file->_IO_read_end;
            }
            *ppcVar13 = (char *)pMVar6;
            __ptr_01->curr_func_item = (MIR_item_t)0x0;
            __ptr_01->debug_file = (FILE *)0x0;
            free(__ptr_01);
            return;
          }
          if ((gen_ctx_t)pMVar15->used_label_p == __ptr_01) {
            pMVar15->used_label_p = (VARR_uint8_t *)__ptr_01->to_free;
            goto LAB_0015fec2;
          }
          delete_edge_cold_1();
LAB_0015ff44:
          delete_edge_cold_2();
LAB_0015ff49:
          delete_edge_cold_3();
LAB_0015ff4e:
          delete_edge_cold_4();
          sVar7 = dv->els_num;
          dv->els_num = sVar7 + 1;
          *(size_t *)&__ptr_01->optimize_level = sVar7;
          for (pVVar8 = __ptr_01->addr_regs; pVVar8 != (bitmap_t)0x0;
              pVVar8 = (bitmap_t)pVVar8[1].varr) {
            bb = (bb_t_conflict)pVVar8->size;
            if (bb->pre == 0) {
              DFS(bb,&dv->els_num,rpost);
            }
            else if (bb->rpost == 0) {
              *(undefined1 *)((long)&pVVar8[2].els_num + 1) = 1;
            }
          }
          pMVar6 = (MIR_item_t)*rpost;
          *rpost = (size_t)((long)&pMVar6[-1].u + 7);
          __ptr_01->curr_func_item = pMVar6;
          return;
        }
      }
      else {
        pDVar11 = &((dead_var_t)dv->varr)->dead_var_link;
      }
      pDVar11->prev = pdVar3;
      ((DLIST_LINK_dead_var_t *)&dv->size)->prev = (dead_var_t)0x0;
      dv->varr = (uint8_t *)0x0;
      __ptr_01 = pgVar16;
      free_dead_var(pgVar16,(dead_var_t_conflict)dv);
      dv = (VARR_uint8_t *)((DLIST_dead_var_t *)&pMVar15->temp_data)->head;
    } while (dv != (VARR_uint8_t *)0x0);
  }
  return;
}

Assistant:

static void delete_insn_data (MIR_insn_t insn) {
  insn_data_t insn_data = insn->data;

  if (insn_data == NULL || !insn_data_p (insn)) return;
  if (MIR_call_code_p (insn->code) && insn_data->u.call_hard_reg_args != NULL)
    bitmap_destroy (insn_data->u.call_hard_reg_args);
  free (insn_data);
}